

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::DirectStateAccess::Textures::CompressedSubImageTest::Test<3u>
          (CompressedSubImageTest *this,GLenum internalformat)

{
  bool bVar1;
  GLenum GVar2;
  GLenum internalformat_local;
  CompressedSubImageTest *this_local;
  
  GVar2 = TextureTarget<3u>(this);
  CreateTextures(this,GVar2);
  PrepareReferenceData<3u>(this,internalformat);
  PrepareStorage<3u>(this,internalformat);
  bVar1 = CompressedTextureSubImage<3u>(this,internalformat);
  if (bVar1) {
    if (this->m_reference != (GLubyte *)0x0) {
      GVar2 = TextureTarget<3u>(this);
      bVar1 = CheckData(this,GVar2,internalformat);
      if (!bVar1) {
        CleanAll(this);
        return false;
      }
    }
    CleanAll(this);
    this_local._7_1_ = true;
  }
  else {
    CleanAll(this);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool CompressedSubImageTest::Test(glw::GLenum internalformat)
{
	/* Create texture image. */
	CreateTextures(TextureTarget<D>());
	PrepareReferenceData<D>(internalformat);
	PrepareStorage<D>(internalformat);

	/* Setup data with CompressedTextureSubImage<D>D function and check for errors. */
	if (!CompressedTextureSubImage<D>(internalformat))
	{
		CleanAll();

		return false;
	}

	/* If compressed reference data was generated than compare values. */
	if (m_reference)
	{
		if (!CheckData(TextureTarget<D>(), internalformat))
		{
			CleanAll();

			return false;
		}
	}

	CleanAll();

	return true;
}